

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O1

void __thiscall roundTripString::~roundTripString(roundTripString *this)

{
  testing::Test::~Test
            ((Test *)&this[-1].
                      super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(roundTripString, rtripconversions)
{
    auto u1 = unit_from_string(GetParam());
    EXPECT_FALSE(is_error(u1));
    auto str = to_string(u1);
    auto u2 = unit_from_string(str);
    EXPECT_FALSE(is_error(u2));
    EXPECT_EQ(unit_cast(u2), unit_cast(u1));
}